

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeM34.cpp
# Opt level: O0

bool metric34_line_is_bigger(metric34_line_t x,metric34_line_t y)

{
  int iVar1;
  bool local_9;
  bool ret;
  
  local_9 = false;
  if ((double)x.domain._56_8_ <= (double)y.domain._56_8_) {
    if (((double)x.domain._56_8_ == (double)y.domain._56_8_) &&
       (!NAN((double)x.domain._56_8_) && !NAN((double)y.domain._56_8_))) {
      iVar1 = CaptureSummary::compare_string(&stack0x00000008,(char *)&x.frequency);
      local_9 = 0 < iVar1;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool metric34_line_is_bigger(metric34_line_t x, metric34_line_t y)
{
    bool ret = false;

    if (x.frequency > y.frequency)
    {
        ret = true;
    }
    else if (x.frequency == y.frequency)
    {
        ret = CaptureSummary::compare_string(x.domain, y.domain) > 0;
    }

    return (ret);
}